

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O2

ChainstateLoadResult *
node::CompleteChainstateInitialization
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *this;
  bool should_wipe;
  CoinsViews *pCVar1;
  pointer ppCVar2;
  path leveldb_name;
  uint __line;
  _Alloc_hider __p;
  bool bVar3;
  CBlockIndex *pCVar4;
  Chainstate *pCVar5;
  ulong uVar6;
  CCoinsViewErrorCatcher *pCVar7;
  CCoinsViewDB *this_00;
  CCoinsViewCache *pCVar8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var9;
  bilingual_str *this_01;
  char *pcVar10;
  long lVar11;
  long lVar12;
  pointer ppCVar13;
  long in_FS_OFFSET;
  double dVar14;
  string_view source_file;
  string_view logging_function;
  undefined8 in_stack_fffffffffffffe68;
  function<void_()> *__x;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var15;
  ChainstateLoadStatus local_16c;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  function<void_()> local_150;
  bilingual_str local_130;
  path local_f0;
  bilingual_str local_c8;
  path local_88;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = &(chainman->m_blockman).m_block_tree_db;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)0x0);
  std::filesystem::__cxx11::path::path(&local_88,&(chainman->m_options).datadir.super_path);
  fs::operator/((path *)&local_60,(path *)&local_88,"blocks");
  fs::operator/((path *)&local_c8,(path *)&local_60,"index");
  local_c8.translated._M_string_length = cache_sizes->block_tree_db;
  local_c8.translated.field_2._M_local_buf[0] = options->block_tree_db_in_memory;
  local_c8.translated.field_2._M_local_buf[1] = options->wipe_block_tree_db;
  local_c8.translated.field_2._M_local_buf[2] = '\0';
  local_c8.translated.field_2._M_local_buf[3] = (chainman->m_options).block_tree_db.force_compact;
  std::make_unique<kernel::BlockTreeDB,DBParams>((DBParams *)&local_130);
  __p._M_p = local_130.original._M_dataplus._M_p;
  local_130.original._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::reset
            ((__uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)this
             ,(pointer)__p._M_p);
  std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::~unique_ptr
            ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
             &local_130);
  std::filesystem::__cxx11::path::~path((path *)&local_c8);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  if (options->wipe_block_tree_db == true) {
    kernel::BlockTreeDB::WriteReindexing
              ((chainman->m_blockman).m_block_tree_db._M_t.
               super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
               ._M_t.
               super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
               .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,true);
    LOCK();
    (chainman->m_blockman).m_blockfiles_indexed._M_base._M_i = false;
    UNLOCK();
    if (options->prune == true) {
      BlockManager::CleanupBlockRevFiles(&chainman->m_blockman);
    }
  }
  bVar3 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
  if (bVar3) {
    local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
    local_c8.original._M_string_length = 0;
    local_c8.original.field_2._M_local_buf[0] = '\0';
    local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
    local_c8.translated._M_string_length = 0;
    local_c8.translated.field_2._M_local_buf[0] = '\0';
    bilingual_str::bilingual_str((bilingual_str *)__return_storage_ptr__,&local_c8);
LAB_0076d002:
    (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
    super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = INTERRUPTED;
  }
  else {
    bVar3 = ChainstateManager::LoadBlockIndex(chainman);
    if (!bVar3) {
      bVar3 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
      if (!bVar3) {
        local_130.original._M_dataplus._M_p._0_4_ = 1;
        pcVar10 = "Error loading block database";
        goto LAB_0076d367;
      }
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      local_c8.original._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
      local_c8.translated._M_string_length = 0;
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      bilingual_str::bilingual_str((bilingual_str *)__return_storage_ptr__,&local_c8);
      goto LAB_0076d002;
    }
    if (((chainman->m_blockman).m_block_index._M_h._M_element_count == 0) ||
       (pCVar4 = BlockManager::LookupBlockIndex
                           (&chainman->m_blockman,(uint256 *)(chainman->m_options).chainparams),
       pCVar4 != (CBlockIndex *)0x0)) {
      if (((chainman->m_blockman).m_have_pruned == true) && (options->prune == false)) {
        local_130.original._M_dataplus._M_p._0_4_ = 1;
        pcVar10 = 
        "You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain"
        ;
        goto LAB_0076d367;
      }
      if (((chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0) {
        pCVar5 = ChainstateManager::ActiveChainstate(chainman);
        bVar3 = Chainstate::LoadGenesisBlock(pCVar5);
        if (!bVar3) {
          local_130.original._M_dataplus._M_p._0_4_ = 1;
          pcVar10 = "Error initializing block database";
          goto LAB_0076d367;
        }
      }
      if (chainman->m_total_coinstip_cache < 1) {
        pcVar10 = "chainman.m_total_coinstip_cache > 0";
        __line = 0x5f;
LAB_0076d674:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                      ,__line,
                      "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      if (chainman->m_total_coinsdb_cache < 1) {
        pcVar10 = "chainman.m_total_coinsdb_cache > 0";
        __line = 0x60;
        goto LAB_0076d674;
      }
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_130,chainman);
      __x = &options->coins_error_cb;
      _Var15._M_head_impl = (_Impl *)local_130.original._M_string_length;
      for (_Var9._M_head_impl = (_Impl *)local_130.original._M_dataplus._M_p;
          _Var9._M_head_impl != _Var15._M_head_impl; _Var9._M_head_impl = _Var9._M_head_impl + 8) {
        pCVar5 = *(Chainstate **)_Var9._M_head_impl;
        Chainstate::ToString_abi_cxx11_(&local_c8.original,pCVar5);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file._M_len = 99;
        logging_function._M_str = "CompleteChainstateInitialization";
        logging_function._M_len = 0x20;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x6c,ALL,Info,(ConstevalFormatString<1U>)0xc9ed8c,
                   &local_c8.original);
        std::__cxx11::string::~string((string *)&local_c8);
        lVar11 = chainman->m_total_coinsdb_cache;
        bVar3 = options->coins_db_in_memory;
        should_wipe = options->wipe_chainstate_db;
        fs::path::path((path *)&local_f0,"chainstate");
        dVar14 = (double)lVar11 * 0.2;
        uVar6 = (ulong)dVar14;
        leveldb_name.super_path._M_pathname._M_string_length = (size_type)__return_storage_ptr__;
        leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
        leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)__x;
        leveldb_name.super_path._M_pathname.field_2._8_8_ = _Var15._M_head_impl;
        leveldb_name.super_path._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                )_Var9._M_head_impl;
        Chainstate::InitCoinsDB
                  (pCVar5,(long)(dVar14 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6,bVar3
                   ,should_wipe,leveldb_name);
        std::filesystem::__cxx11::path::~path(&local_f0);
        if ((options->coins_error_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
          pCVar7 = Chainstate::CoinsErrorCatcher(pCVar5);
          std::function<void_()>::function(&local_150,__x);
          std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
          emplace_back<std::function<void()>>
                    ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
                     &pCVar7->m_err_callbacks,&local_150);
          std::_Function_base::~_Function_base(&local_150.super__Function_base);
        }
        this_00 = Chainstate::CoinsDB(pCVar5);
        bVar3 = CCoinsViewDB::NeedsUpgrade(this_00);
        if (bVar3) {
          chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 3;
          _(&local_c8,(ConstevalStringLiteral)0xc9eda8);
LAB_0076d497:
          std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
          tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                    (__return_storage_ptr__,(ChainstateLoadStatus *)&chainstates,&local_c8);
          bilingual_str::~bilingual_str(&local_c8);
          this_01 = &local_130;
          goto LAB_0076d4af;
        }
        bVar3 = Chainstate::ReplayBlocks(pCVar5);
        if (!bVar3) {
          chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 1;
          _(&local_c8,(ConstevalStringLiteral)0xc9ee2a);
          goto LAB_0076d497;
        }
        dVar14 = (double)chainman->m_total_coinstip_cache * 0.2;
        uVar6 = (ulong)dVar14;
        Chainstate::InitCoinsCache
                  (pCVar5,(long)(dVar14 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
        pCVar1 = (pCVar5->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar1 == (CoinsViews *)0x0) ||
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar1->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> ==
            (CCoinsViewCache *)0x0)) {
          __assert_fail("chainstate->CanFlushToDisk()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                        ,0x86,
                        "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                       );
        }
        if (options->wipe_chainstate_db != true) {
          pCVar8 = Chainstate::CoinsTip(pCVar5);
          (*(pCVar8->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&local_c8,pCVar8)
          ;
          bVar3 = base_blob<256U>::IsNull((base_blob<256U> *)&local_c8);
          if (!bVar3) {
            bVar3 = Chainstate::LoadChainTip(pCVar5);
            if (!bVar3) {
              chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = 1;
              _(&local_c8,(ConstevalStringLiteral)0xc9ec7e);
              goto LAB_0076d497;
            }
            ppCVar2 = (pCVar5->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((ppCVar2 ==
                 (pCVar5->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start) || (ppCVar2[-1] == (CBlockIndex *)0x0)) {
              __assert_fail("chainstate->m_chain.Tip() != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                            ,0x8d,
                            "ChainstateLoadResult node::CompleteChainstateInitialization(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                           );
            }
          }
        }
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_130);
      if (options->wipe_block_tree_db == false) {
        ChainstateManager::GetAll(&chainstates,chainman);
        ppCVar13 = (pointer)CONCAT44(chainstates.
                                     super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     chainstates.
                                     super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_);
        lVar11 = (long)chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar13;
        for (lVar12 = lVar11 >> 5; 0 < lVar12; lVar12 = lVar12 + -1) {
          bVar3 = Chainstate::NeedsRedownload(*ppCVar13);
          if (bVar3) goto LAB_0076d543;
          bVar3 = Chainstate::NeedsRedownload(ppCVar13[1]);
          if (bVar3) {
            ppCVar13 = ppCVar13 + 1;
            goto LAB_0076d543;
          }
          bVar3 = Chainstate::NeedsRedownload(ppCVar13[2]);
          if (bVar3) {
            ppCVar13 = ppCVar13 + 2;
            goto LAB_0076d543;
          }
          bVar3 = Chainstate::NeedsRedownload(ppCVar13[3]);
          if (bVar3) {
            ppCVar13 = ppCVar13 + 3;
            goto LAB_0076d543;
          }
          ppCVar13 = ppCVar13 + 4;
          lVar11 = lVar11 + -0x20;
        }
        lVar11 = lVar11 >> 3;
        if (lVar11 == 1) {
LAB_0076d523:
          bVar3 = Chainstate::NeedsRedownload(*ppCVar13);
          if (!bVar3) {
            ppCVar13 = chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          }
LAB_0076d543:
          if (ppCVar13 !=
              chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_16c = FAILURE;
            _(&local_130,(ConstevalStringLiteral)0xc9eec6);
            tinyformat::format<int>
                      (&local_c8,&local_130,
                       &(((chainman->m_options).chainparams)->consensus).SegwitHeight);
            std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
            tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                      (__return_storage_ptr__,&local_16c,&local_c8);
            bilingual_str::~bilingual_str(&local_c8);
            bilingual_str::~bilingual_str(&local_130);
            this_01 = (bilingual_str *)&chainstates;
LAB_0076d4af:
            std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                      ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)this_01);
            goto LAB_0076d38d;
          }
        }
        else {
          if (lVar11 == 2) {
LAB_0076d513:
            bVar3 = Chainstate::NeedsRedownload(*ppCVar13);
            if (!bVar3) {
              ppCVar13 = ppCVar13 + 1;
              goto LAB_0076d523;
            }
            goto LAB_0076d543;
          }
          if (lVar11 == 3) {
            bVar3 = Chainstate::NeedsRedownload(*ppCVar13);
            if (!bVar3) {
              ppCVar13 = ppCVar13 + 1;
              goto LAB_0076d513;
            }
            goto LAB_0076d543;
          }
        }
        std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                  (&chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>);
      }
      ChainstateManager::MaybeRebalanceCaches(chainman);
      local_c8.original._M_dataplus._M_p = (pointer)&local_c8.original.field_2;
      local_c8.original._M_string_length = 0;
      local_c8.original.field_2._M_local_buf[0] = '\0';
      local_c8.translated._M_dataplus._M_p = (pointer)&local_c8.translated.field_2;
      local_c8.translated._M_string_length = 0;
      local_c8.translated.field_2._M_local_buf[0] = '\0';
      bilingual_str::bilingual_str((bilingual_str *)__return_storage_ptr__,&local_c8);
      *(undefined4 *)
       &(((bilingual_str *)((long)__return_storage_ptr__ + 0x40))->original)._M_dataplus._M_p = 0;
    }
    else {
      local_130.original._M_dataplus._M_p._0_4_ = 3;
      pcVar10 = "Incorrect or no genesis block found. Wrong datadir for network?";
LAB_0076d367:
      _(&local_c8,(ConstevalStringLiteral)pcVar10);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                (__return_storage_ptr__,(ChainstateLoadStatus *)&local_130,&local_c8);
    }
  }
  bilingual_str::~bilingual_str(&local_c8);
LAB_0076d38d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (ChainstateLoadResult *)(bilingual_str *)__return_storage_ptr__;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    auto& pblocktree{chainman.m_blockman.m_block_tree_db};
    // new BlockTreeDB tries to delete the existing file, which
    // fails if it's still open from the previous loop. Close it first:
    pblocktree.reset();
    pblocktree = std::make_unique<BlockTreeDB>(DBParams{
        .path = chainman.m_options.datadir / "blocks" / "index",
        .cache_bytes = static_cast<size_t>(cache_sizes.block_tree_db),
        .memory_only = options.block_tree_db_in_memory,
        .wipe_data = options.wipe_block_tree_db,
        .options = chainman.m_options.block_tree_db});

    if (options.wipe_block_tree_db) {
        pblocktree->WriteReindexing(true);
        chainman.m_blockman.m_blockfiles_indexed = false;
        //If we're reindexing in prune mode, wipe away unusable block files and all undo data files
        if (options.prune) {
            chainman.m_blockman.CleanupBlockRevFiles();
        }
    }

    if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};

    // LoadBlockIndex will load m_have_pruned if we've ever removed a
    // block file from disk.
    // Note that it also sets m_blockfiles_indexed based on the disk flag!
    if (!chainman.LoadBlockIndex()) {
        if (chainman.m_interrupt) return {ChainstateLoadStatus::INTERRUPTED, {}};
        return {ChainstateLoadStatus::FAILURE, _("Error loading block database")};
    }

    if (!chainman.BlockIndex().empty() &&
            !chainman.m_blockman.LookupBlockIndex(chainman.GetConsensus().hashGenesisBlock)) {
        // If the loaded chain has a wrong genesis, bail out immediately
        // (we're likely using a testnet datadir, or the other way around).
        return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Incorrect or no genesis block found. Wrong datadir for network?")};
    }

    // Check for changed -prune state.  What we are concerned about is a user who has pruned blocks
    // in the past, but is now trying to run unpruned.
    if (chainman.m_blockman.m_have_pruned && !options.prune) {
        return {ChainstateLoadStatus::FAILURE, _("You need to rebuild the database using -reindex to go back to unpruned mode.  This will redownload the entire blockchain")};
    }

    // At this point blocktree args are consistent with what's on disk.
    // If we're not mid-reindex (based on disk + args), add a genesis block on disk
    // (otherwise we use the one already on disk).
    // This is called again in ImportBlocks after the reindex completes.
    if (chainman.m_blockman.m_blockfiles_indexed && !chainman.ActiveChainstate().LoadGenesisBlock()) {
        return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
    }

    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    assert(chainman.m_total_coinstip_cache > 0);
    assert(chainman.m_total_coinsdb_cache > 0);

    // Conservative value which is arbitrarily chosen, as it will ultimately be changed
    // by a call to `chainman.MaybeRebalanceCaches()`. We just need to make sure
    // that the sum of the two caches (40%) does not exceed the allowable amount
    // during this temporary initialization state.
    double init_cache_fraction = 0.2;

    // At this point we're either in reindex or we've loaded a useful
    // block tree into BlockIndex()!

    for (Chainstate* chainstate : chainman.GetAll()) {
        LogPrintf("Initializing chainstate %s\n", chainstate->ToString());

        chainstate->InitCoinsDB(
            /*cache_size_bytes=*/chainman.m_total_coinsdb_cache * init_cache_fraction,
            /*in_memory=*/options.coins_db_in_memory,
            /*should_wipe=*/options.wipe_chainstate_db);

        if (options.coins_error_cb) {
            chainstate->CoinsErrorCatcher().AddReadErrCallback(options.coins_error_cb);
        }

        // Refuse to load unsupported database format.
        // This is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (chainstate->CoinsDB().NeedsUpgrade()) {
            return {ChainstateLoadStatus::FAILURE_INCOMPATIBLE_DB, _("Unsupported chainstate database format found. "
                                                                     "Please restart with -reindex-chainstate. This will "
                                                                     "rebuild the chainstate database.")};
        }

        // ReplayBlocks is a no-op if we cleared the coinsviewdb with -reindex or -reindex-chainstate
        if (!chainstate->ReplayBlocks()) {
            return {ChainstateLoadStatus::FAILURE, _("Unable to replay blocks. You will need to rebuild the database using -reindex-chainstate.")};
        }

        // The on-disk coinsdb is now in a good state, create the cache
        chainstate->InitCoinsCache(chainman.m_total_coinstip_cache * init_cache_fraction);
        assert(chainstate->CanFlushToDisk());

        if (!is_coinsview_empty(chainstate)) {
            // LoadChainTip initializes the chain based on CoinsTip()'s best block
            if (!chainstate->LoadChainTip()) {
                return {ChainstateLoadStatus::FAILURE, _("Error initializing block database")};
            }
            assert(chainstate->m_chain.Tip() != nullptr);
        }
    }

    if (!options.wipe_block_tree_db) {
        auto chainstates{chainman.GetAll()};
        if (std::any_of(chainstates.begin(), chainstates.end(),
                        [](const Chainstate* cs) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return cs->NeedsRedownload(); })) {
            return {ChainstateLoadStatus::FAILURE, strprintf(_("Witness data for blocks after height %d requires validation. Please restart with -reindex."),
                                                             chainman.GetConsensus().SegwitHeight)};
        };
    }

    // Now that chainstates are loaded and we're able to flush to
    // disk, rebalance the coins caches to desired levels based
    // on the condition of each chainstate.
    chainman.MaybeRebalanceCaches();

    return {ChainstateLoadStatus::SUCCESS, {}};
}